

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

argParserAdvancedConfiguration * __thiscall
argvParser::addArg(argvParser *this,string *argvShort,string *argvLong,string *help,
                  _func_int_int_char_ptr_ptr *callBack)

{
  argParserAdvancedConfiguration *paVar1;
  function<int_(int,_char_**)> local_e8;
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  anon_class_8_1_dd99b9e3 local_58;
  undefined1 local_50 [8];
  function<int_(int,_char_**)> tmpCallback;
  _func_int_int_char_ptr_ptr *callBack_local;
  string *help_local;
  string *argvLong_local;
  string *argvShort_local;
  argvParser *this_local;
  
  local_58.callBack = callBack;
  tmpCallback._M_invoker = (_Invoker_type)callBack;
  std::function<int(int,char**)>::
  function<argvParser::addArg(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int(*)(int,char**))::__0,void>
            ((function<int(int,char**)> *)local_50,&local_58);
  std::__cxx11::string::string(local_78,(string *)argvShort);
  std::__cxx11::string::string(local_a8,(string *)argvLong);
  std::__cxx11::string::string(local_c8,(string *)help);
  std::function<int_(int,_char_**)>::function(&local_e8,(function<int_(int,_char_**)> *)local_50);
  paVar1 = addArg(this,(string *)local_78,(string *)local_a8,(string *)local_c8,&local_e8);
  std::function<int_(int,_char_**)>::~function(&local_e8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_78);
  std::function<int_(int,_char_**)>::~function((function<int_(int,_char_**)> *)local_50);
  return paVar1;
}

Assistant:

argParserAdvancedConfiguration * argvParser::addArg(string argvShort, string argvLong, string help, int (*callBack)(int, char **)) {
    function<int(int, char **)> tmpCallback = [callBack](int i, char **argv) { return callBack(i, argv); };
    return addArg(argvShort, argvLong, help, tmpCallback);
}